

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

hash_request * __thiscall
libtorrent::aux::torrent::pick_hashes
          (hash_request *__return_storage_ptr__,torrent *this,peer_connection *peer)

{
  hash_picker *this_00;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *pieces;
  
  need_hash_picker(this);
  this_00 = (this->super_torrent_hot_members).m_hash_picker._M_t.
            super___uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
            ._M_t.
            super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
            .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl;
  if (this_00 == (hash_picker *)0x0) {
    __return_storage_ptr__->file = 0;
    __return_storage_ptr__->base = 0;
    __return_storage_ptr__->index = 0;
    __return_storage_ptr__->count = 0;
    __return_storage_ptr__->proof_layers = 0;
  }
  else {
    pieces = peer_connection::get_bitfield(peer);
    hash_picker::pick_hashes(__return_storage_ptr__,this_00,pieces);
  }
  return __return_storage_ptr__;
}

Assistant:

hash_request torrent::pick_hashes(peer_connection* peer)
	{
		need_hash_picker();
		if (!m_hash_picker) return {};
		return m_hash_picker->pick_hashes(peer->get_bitfield());
	}